

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O1

void do_type(session_t *sess)

{
  int iVar1;
  char *text;
  
  iVar1 = strcmp(sess->cmd_arg,"A");
  if (iVar1 == 0) {
    sess->is_ascii = 1;
    text = "Switch to ASCII mode";
  }
  else {
    iVar1 = strcmp(sess->cmd_arg,"I");
    if (iVar1 != 0) {
      text = "Unrecognised command.";
      iVar1 = 500;
      goto LAB_00104bce;
    }
    sess->is_ascii = 0;
    text = "Switch to Binary mode";
  }
  iVar1 = 200;
LAB_00104bce:
  ftp_relply(sess,iVar1,text);
  return;
}

Assistant:

void do_type(session_t *sess) {
  if (strcmp(sess->cmd_arg, "A") == 0) {
    sess->is_ascii = 1;
    ftp_relply(sess, FTP_TYPEOK, "Switch to ASCII mode");
  } else if (strcmp(sess->cmd_arg, "I") == 0) {
    sess->is_ascii = 0;
    ftp_relply(sess, FTP_TYPEOK, "Switch to Binary mode");
  } else {
    ftp_relply(sess, FTP_BADCMD, "Unrecognised command.");
  }
}